

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

void av1_get_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,uint8_t *y_src,int stride,int block_size,
               uint32_t *hash_value1,uint32_t *hash_value2,int use_highbitdepth)

{
  CRC_CALCULATOR *p_crc_calculator;
  CRC_CALCULATOR *p_crc_calculator_00;
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t *puVar13;
  uint16_t *y_src_00;
  uint8_t *y_src_01;
  int x_pos;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint32_t to_hash [4];
  
  p_crc_calculator = &intrabc_hash_info->crc_calculator1;
  p_crc_calculator_00 = &intrabc_hash_info->crc_calculator2;
  uVar3 = block_size >> 1;
  if (use_highbitdepth == 0) {
    lVar17 = 0;
    for (lVar8 = 0; lVar8 < block_size; lVar8 = lVar8 + 2) {
      y_src_01 = y_src;
      lVar16 = lVar17;
      for (lVar14 = 0; lVar14 < block_size; lVar14 = lVar14 + 2) {
        get_pixels_in_1D_char_array_by_block_2x2(y_src_01,stride,(uint8_t *)to_hash);
        uVar4 = av1_get_crc_value(p_crc_calculator,(uint8_t *)to_hash,4);
        *(uint32_t *)((long)intrabc_hash_info->hash_value_buffer[0][0] + lVar16) = uVar4;
        uVar4 = av1_get_crc_value(p_crc_calculator_00,(uint8_t *)to_hash,4);
        *(uint32_t *)((long)intrabc_hash_info->hash_value_buffer[1][0] + lVar16) = uVar4;
        y_src_01 = y_src_01 + 2;
        lVar16 = lVar16 + 4;
      }
      y_src = y_src + (long)stride * 2;
      lVar17 = lVar17 + (long)(int)uVar3 * 4;
    }
  }
  else {
    puVar13 = (uint16_t *)((long)y_src * 2);
    lVar17 = 0;
    for (lVar8 = 0; lVar8 < block_size; lVar8 = lVar8 + 2) {
      y_src_00 = puVar13;
      lVar16 = lVar17;
      for (lVar14 = 0; lVar14 < block_size; lVar14 = lVar14 + 2) {
        get_pixels_in_1D_short_array_by_block_2x2(y_src_00,stride,(uint16_t *)to_hash);
        uVar4 = av1_get_crc_value(p_crc_calculator,(uint8_t *)to_hash,8);
        *(uint32_t *)((long)intrabc_hash_info->hash_value_buffer[0][0] + lVar16) = uVar4;
        uVar4 = av1_get_crc_value(p_crc_calculator_00,(uint8_t *)to_hash,8);
        *(uint32_t *)((long)intrabc_hash_info->hash_value_buffer[1][0] + lVar16) = uVar4;
        y_src_00 = y_src_00 + 2;
        lVar16 = lVar16 + 4;
      }
      puVar13 = puVar13 + (long)stride * 2;
      lVar17 = lVar17 + (long)(int)uVar3 * 4;
    }
  }
  iVar7 = 4;
  uVar9 = 0;
  uVar10 = 1;
  uVar2 = block_size >> 2;
  while( true ) {
    uVar5 = uVar2;
    if (block_size < iVar7) break;
    uVar10 = (ulong)(1 - (int)uVar10);
    uVar9 = (ulong)(1 - (int)uVar9);
    lVar8 = (long)(int)uVar3;
    uVar11 = 0;
    if (0 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    iVar6 = 0;
    lVar17 = 0;
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      lVar17 = (long)(int)lVar17;
      for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
        puVar1 = intrabc_hash_info->hash_value_buffer[0][uVar10];
        to_hash[0] = puVar1[(long)iVar6 + uVar15 * 2];
        to_hash[1] = puVar1[(long)iVar6 + uVar15 * 2 + 1];
        to_hash[2] = puVar1[(long)iVar6 + lVar8 + uVar15 * 2];
        to_hash[3] = puVar1[(long)iVar6 + lVar8 + uVar15 * 2 + 1];
        uVar4 = av1_get_crc_value(p_crc_calculator,(uint8_t *)to_hash,0x10);
        intrabc_hash_info->hash_value_buffer[0][uVar9][lVar17 + uVar15] = uVar4;
        puVar1 = intrabc_hash_info->hash_value_buffer[1][uVar10];
        to_hash[0] = puVar1[(long)iVar6 + uVar15 * 2];
        to_hash[1] = puVar1[(long)iVar6 + uVar15 * 2 + 1];
        to_hash[2] = puVar1[(long)iVar6 + lVar8 + uVar15 * 2];
        to_hash[3] = puVar1[(long)iVar6 + lVar8 + uVar15 * 2 + 1];
        uVar4 = av1_get_crc_value(p_crc_calculator_00,(uint8_t *)to_hash,0x10);
        intrabc_hash_info->hash_value_buffer[1][uVar9][lVar17 + uVar15] = uVar4;
      }
      iVar6 = iVar6 + uVar3 * 2;
      lVar17 = lVar17 + uVar15;
    }
    iVar7 = iVar7 * 2;
    uVar2 = (int)uVar5 >> 1;
    uVar3 = uVar5;
  }
  iVar7 = hash_block_size_to_index(block_size);
  *hash_value1 = (uint)(ushort)*intrabc_hash_info->hash_value_buffer[0][uVar9] | iVar7 << 0x10;
  *hash_value2 = *intrabc_hash_info->hash_value_buffer[1][uVar9];
  return;
}

Assistant:

void av1_get_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                              const uint8_t *y_src, int stride, int block_size,
                              uint32_t *hash_value1, uint32_t *hash_value2,
                              int use_highbitdepth) {
  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;
  uint32_t **buf_1 = intrabc_hash_info->hash_value_buffer[0];
  uint32_t **buf_2 = intrabc_hash_info->hash_value_buffer[1];

  // 2x2 subblock hash values in current CU
  int sub_block_in_width = (block_size >> 1);
  if (use_highbitdepth) {
    uint16_t pixel_to_hash[4];
    uint16_t *y16_src = CONVERT_TO_SHORTPTR(y_src);
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_short_array_by_block_2x2(
            y16_src + y_pos * stride + x_pos, stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] = av1_get_crc_value(calc_1, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
        buf_2[0][pos] = av1_get_crc_value(calc_2, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
      }
    }
  } else {
    uint8_t pixel_to_hash[4];
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_char_array_by_block_2x2(y_src + y_pos * stride + x_pos,
                                                 stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] =
            av1_get_crc_value(calc_1, pixel_to_hash, sizeof(pixel_to_hash));
        buf_2[0][pos] =
            av1_get_crc_value(calc_2, pixel_to_hash, sizeof(pixel_to_hash));
      }
    }
  }

  int src_sub_block_in_width = sub_block_in_width;
  sub_block_in_width >>= 1;

  int src_idx = 1;
  int dst_idx = 0;

  // 4x4 subblock hash values to current block hash values
  uint32_t to_hash[4];
  for (int sub_width = 4; sub_width <= block_size; sub_width *= 2) {
    src_idx = 1 - src_idx;
    dst_idx = 1 - dst_idx;

    int dst_pos = 0;
    for (int y_pos = 0; y_pos < sub_block_in_width; y_pos++) {
      for (int x_pos = 0; x_pos < sub_block_in_width; x_pos++) {
        int srcPos = (y_pos << 1) * src_sub_block_in_width + (x_pos << 1);

        assert(srcPos + 1 < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(srcPos + src_sub_block_in_width + 1 <
               AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(dst_pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        to_hash[0] = buf_1[src_idx][srcPos];
        to_hash[1] = buf_1[src_idx][srcPos + 1];
        to_hash[2] = buf_1[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_1[src_idx][srcPos + src_sub_block_in_width + 1];

        buf_1[dst_idx][dst_pos] =
            av1_get_crc_value(calc_1, (uint8_t *)to_hash, sizeof(to_hash));

        to_hash[0] = buf_2[src_idx][srcPos];
        to_hash[1] = buf_2[src_idx][srcPos + 1];
        to_hash[2] = buf_2[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_2[src_idx][srcPos + src_sub_block_in_width + 1];
        buf_2[dst_idx][dst_pos] =
            av1_get_crc_value(calc_2, (uint8_t *)to_hash, sizeof(to_hash));
        dst_pos++;
      }
    }

    src_sub_block_in_width = sub_block_in_width;
    sub_block_in_width >>= 1;
  }

  *hash_value1 = (buf_1[dst_idx][0] & crc_mask) + add_value;
  *hash_value2 = buf_2[dst_idx][0];
}